

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall
Js::CompoundString::CompoundString
          (CompoundString *this,CharCount initialBlockSize,bool allocateBlock,
          JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  StaticType *type;
  undefined4 *puVar3;
  Block *block;
  undefined7 in_register_00000011;
  
  type = StringCache::GetStringTypeStatic(&library->stringCache);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0138ed08;
  BlockInfo::BlockInfo(&this->lastBlockInfo);
  this->directCharLength = 0xffffffff;
  this->ownsLastBlock = true;
  (this->lastBlock).ptr = (Block *)0x0;
  if ((int)CONCAT71(in_register_00000011,allocateBlock) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1d9,"(allocateBlock)","allocateBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  block = Block::New(initialBlockSize,(Block *)0x0,library->recycler);
  BlockInfo::CopyFrom(&this->lastBlockInfo,block);
  Memory::WriteBarrierPtr<Js::CompoundString::Block>::WriteBarrierSet(&this->lastBlock,block);
  return;
}

Assistant:

CompoundString::CompoundString(
        const CharCount initialBlockSize,
        const bool allocateBlock,
        JavascriptLibrary *const library)
        : LiteralString(library->GetStringTypeStatic()),
        directCharLength(static_cast<CharCount>(-1)),
        ownsLastBlock(true)
    {
        Assert(allocateBlock);
        Assert(library);

        Block *const block = Block::New(initialBlockSize, nullptr, library->GetRecycler());
        lastBlockInfo.CopyFrom(block);
        lastBlock = block;
    }